

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

int __thiscall re2::Compiler::AllocInst(Compiler *this,int n)

{
  int len;
  int iVar1;
  Inst *pIVar2;
  int in_ESI;
  PODArray<re2::Prog::Inst> *in_RDI;
  int id;
  PODArray<re2::Prog::Inst> inst;
  int cap;
  Inst *in_stack_ffffffffffffffa0;
  int local_18;
  _Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false> local_4;
  
  if (((*(byte *)&in_RDI[2].ptr_._M_t.
                  super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                  .super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                  super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false> & 1) == 0)
     && ((int)in_RDI[4].ptr_._M_t.
              super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
              super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
              super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
              super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false> + in_ESI <=
         *(int *)&in_RDI[4].ptr_._M_t.
                  super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                  .field_0x4)) {
    len = (int)in_RDI[4].ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false> + in_ESI;
    iVar1 = PODArray<re2::Prog::Inst>::size((PODArray<re2::Prog::Inst> *)0x23922d);
    if (iVar1 < len) {
      local_18 = PODArray<re2::Prog::Inst>::size((PODArray<re2::Prog::Inst> *)0x239249);
      if (local_18 == 0) {
        local_18 = 8;
      }
      for (; local_18 <
             (int)in_RDI[4].ptr_._M_t.
                  super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                  .super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                  super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false> + in_ESI;
          local_18 = local_18 << 1) {
      }
      PODArray<re2::Prog::Inst>::PODArray(in_RDI,len);
      pIVar2 = PODArray<re2::Prog::Inst>::data((PODArray<re2::Prog::Inst> *)0x239298);
      if (pIVar2 != (Inst *)0x0) {
        pIVar2 = PODArray<re2::Prog::Inst>::data((PODArray<re2::Prog::Inst> *)0x2392b4);
        in_stack_ffffffffffffffa0 =
             PODArray<re2::Prog::Inst>::data((PODArray<re2::Prog::Inst> *)0x2392c9);
        memmove(pIVar2,in_stack_ffffffffffffffa0,
                (long)(int)in_RDI[4].ptr_._M_t.
                           super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                           .super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                           super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false> <<
                3);
      }
      pIVar2 = PODArray<re2::Prog::Inst>::data((PODArray<re2::Prog::Inst> *)0x239312);
      memset(pIVar2 + (int)in_RDI[4].ptr_._M_t.
                           super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                           .super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                           super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>,0,
             (long)(local_18 -
                   (int)in_RDI[4].ptr_._M_t.
                        super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                        .super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                        super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>) << 3)
      ;
      PODArray<re2::Prog::Inst>::operator=
                ((PODArray<re2::Prog::Inst> *)in_stack_ffffffffffffffa0,
                 (PODArray<re2::Prog::Inst> *)pIVar2);
      PODArray<re2::Prog::Inst>::~PODArray((PODArray<re2::Prog::Inst> *)0x23935e);
    }
    local_4._M_head_impl.len_ =
         in_RDI[4].ptr_._M_t.
         super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
         super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
         super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
         super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>._M_head_impl;
    in_RDI[4].ptr_._M_t.
    super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
    super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
    super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
    super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false> =
         (_Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>)
         (in_ESI + (int)in_RDI[4].ptr_._M_t.
                        super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                        .super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                        super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false>);
  }
  else {
    *(undefined1 *)
     &in_RDI[2].ptr_._M_t.
      super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
      super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
      super__Tuple_impl<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter>.
      super__Head_base<1UL,_re2::PODArray<re2::Prog::Inst>::Deleter,_false> = 1;
    local_4._M_head_impl.len_ = (Deleter)-1;
  }
  return (int)local_4._M_head_impl.len_;
}

Assistant:

int Compiler::AllocInst(int n) {
  if (failed_ || ninst_ + n > max_ninst_) {
    failed_ = true;
    return -1;
  }

  if (ninst_ + n > inst_.size()) {
    int cap = inst_.size();
    if (cap == 0)
      cap = 8;
    while (ninst_ + n > cap)
      cap *= 2;
    PODArray<Prog::Inst> inst(cap);
    if (inst_.data() != NULL)
      memmove(inst.data(), inst_.data(), ninst_*sizeof inst_[0]);
    memset(inst.data() + ninst_, 0, (cap - ninst_)*sizeof inst_[0]);
    inst_ = std::move(inst);
  }
  int id = ninst_;
  ninst_ += n;
  return id;
}